

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O0

void __thiscall
cmDebugger::cmDebuggerPipeClient_POSIX::WaitForConnection(cmDebuggerPipeClient_POSIX *this)

{
  int iVar1;
  runtime_error *prVar2;
  int *piVar3;
  char *pcVar4;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d4 [8];
  sockaddr_un addr;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  cmDebuggerPipeClient_POSIX *local_10;
  cmDebuggerPipeClient_POSIX *this_local;
  
  local_10 = this;
  iVar1 = socket(1,1,0);
  this->rw_pipe = iVar1;
  if (this->rw_pipe < 0) {
    addr.sun_path[0x65] = '\x01';
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Failed to create socket: ",&local_51);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator+(&local_30,&local_50,pcVar4);
    std::runtime_error::runtime_error(prVar2,(string *)&local_30);
    addr.sun_path[0x65] = '\0';
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_d4._0_2_ = 1;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  strncpy(local_d4 + 2,pcVar4,0x6c);
  addr.sun_path[99] = '\0';
  iVar1 = connect(this->rw_pipe,(sockaddr *)local_d4,0x6e);
  if (iVar1 == -1) {
    (**(code **)((long)(this->super_ReaderWriter).super_Reader + 0x18))();
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_118,"Failed to connect path to socket: ",&local_119);
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    std::operator+(&local_f8,&local_118,pcVar4);
    std::runtime_error::runtime_error(prVar2,(string *)&local_f8);
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void cmDebuggerPipeClient_POSIX::WaitForConnection()
{
  rw_pipe = socket(AF_UNIX, SOCK_STREAM, 0);
  if (rw_pipe < 0) {
    throw std::runtime_error(std::string("Failed to create socket: ") +
                             strerror(errno));
  }

  sockaddr_un addr;
  addr.sun_family = AF_UNIX;
  strncpy(addr.sun_path, PipeName.c_str(), sizeof(addr.sun_path));
  addr.sun_path[sizeof(addr.sun_path) - 1] = '\0';
  if (connect(rw_pipe, (sockaddr*)&addr, sizeof(addr)) == -1) {
    close();
    throw std::runtime_error(
      std::string("Failed to connect path to socket: ") + strerror(errno));
  }
}